

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O3

ostream * glu::decl::operator<<(ostream *str,DeclareStructTypePtr *decl)

{
  char *__s;
  DeclareStructTypePtr *pDVar1;
  size_t sVar2;
  int iVar3;
  pointer pSVar4;
  allocator<char> local_99;
  DeclareStructTypePtr *local_98;
  string local_90;
  DeclareVariable local_70;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"struct",6);
  if ((decl->structPtr->m_typeName)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
    __s = (decl->structPtr->m_typeName)._M_dataplus._M_p;
    if (__s == (char *)0x0 || (decl->structPtr->m_typeName)._M_string_length == 0) {
      std::ios::clear((int)str + (int)str->_vptr_basic_ostream[-3]);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,"\n",1);
  iVar3 = decl->indentLevel;
  if (0 < iVar3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(str,"\t",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,"{\n",2);
  pSVar4 = (decl->structPtr->m_members).
           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = decl;
  if (pSVar4 != (decl->structPtr->m_members).
                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_98 = pDVar1;
      if ((uint)decl->indentLevel < 0x7fffffff) {
        iVar3 = decl->indentLevel + 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(str,"\t",1);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,(pSVar4->m_name)._M_dataplus._M_p,&local_99);
      DeclareVariable::DeclareVariable
                (&local_70,&pSVar4->m_type,&local_90,local_98->indentLevel + 1);
      operator<<(str,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(str,";\n",2);
      decl = local_98;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p,
                        local_70.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_70.varType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pSVar4 = pSVar4 + 1;
      pDVar1 = local_98;
    } while (pSVar4 != (decl->structPtr->m_members).
                       super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  iVar3 = decl->indentLevel;
  if (0 < iVar3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(str,"\t",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,"}",1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DeclareStructTypePtr& decl)
{
	str << "struct";

	// Type name is optional.
	if (decl.structPtr->hasTypeName())
		str << " " << decl.structPtr->getTypeName();

	str << "\n" << indent(decl.indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = decl.structPtr->begin(); memberIter != decl.structPtr->end(); memberIter++)
	{
		str << indent(decl.indentLevel+1);
		str << declare(memberIter->getType(), memberIter->getName(), decl.indentLevel+1) << ";\n";
	}

	str << indent(decl.indentLevel) << "}";

	return str;
}